

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_InitializerListInsert_Test::~Btree_InitializerListInsert_Test
          (Btree_InitializerListInsert_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, InitializerListInsert) {
        phmap::btree_set<std::string> set;
        set.insert({"a", "b"});
        EXPECT_EQ(set.count("a"), 1);
        EXPECT_EQ(set.count("b"), 1);

        phmap::btree_multiset<int> mset;
        mset.insert({1, 1, 4});
        EXPECT_EQ(mset.count(1), 2);
        EXPECT_EQ(mset.count(4), 1);

        phmap::btree_map<int, int> map;
        map.insert({{1, 5}, {2, 10}});
        // Test that inserting one element using an initializer list also works.
        map.insert({3, 15});
        EXPECT_EQ(map[1], 5);
        EXPECT_EQ(map[2], 10);
        EXPECT_EQ(map[3], 15);

        phmap::btree_multimap<int, int> mmap;
        mmap.insert({{1, 5}, {1, 10}});
        auto range = mmap.equal_range(1);
        auto it = range.first;
        ASSERT_NE(it, range.second);
        EXPECT_EQ(it->second, 5);
        ASSERT_NE(++it, range.second);
        EXPECT_EQ(it->second, 10);
        EXPECT_EQ(++it, range.second);
    }